

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

ArrayIndex __thiscall
anon_unknown.dwarf_73daba::Target::AddSourceGroup(Target *this,cmSourceGroup *sg,ArrayIndex si)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  pointer ppVar4;
  reference pvVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>,_bool>
  pVar6;
  Value local_d8;
  undefined1 local_a0 [8];
  SourceGroup g;
  uint local_34;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> _Stack_30;
  ArrayIndex sgIndex;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> local_28;
  iterator i;
  cmSourceGroup *pcStack_18;
  ArrayIndex si_local;
  cmSourceGroup *sg_local;
  Target *this_local;
  
  i.super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>._M_cur.
  _4_4_ = si;
  pcStack_18 = sg;
  sg_local = (cmSourceGroup *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_cmSourceGroup_*,_unsigned_int,_std::hash<const_cmSourceGroup_*>,_std::equal_to<const_cmSourceGroup_*>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>_>
       ::find(&this->SourceGroupsMap,&stack0xffffffffffffffe8);
  _Stack_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_cmSourceGroup_*,_unsigned_int,_std::hash<const_cmSourceGroup_*>,_std::equal_to<const_cmSourceGroup_*>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>_>
       ::end(&this->SourceGroupsMap);
  bVar1 = std::__detail::operator==(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    sVar2 = std::
            vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ::size(&this->SourceGroups);
    local_34 = (uint)sVar2;
    pVar6 = std::
            unordered_map<cmSourceGroup_const*,unsigned_int,std::hash<cmSourceGroup_const*>,std::equal_to<cmSourceGroup_const*>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>>
            ::emplace<cmSourceGroup*&,unsigned_int&>
                      ((unordered_map<cmSourceGroup_const*,unsigned_int,std::hash<cmSourceGroup_const*>,std::equal_to<cmSourceGroup_const*>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>>
                        *)&this->SourceGroupsMap,&stack0xffffffffffffffe8,&local_34);
    g.SourceIndexes.limit_ =
         (ptrdiff_t)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>.
         _M_cur;
    local_28._M_cur = (__node_type *)g.SourceIndexes.limit_;
    SourceGroup::SourceGroup((SourceGroup *)local_a0);
    psVar3 = cmSourceGroup::GetFullName_abi_cxx11_(pcStack_18);
    std::__cxx11::string::operator=((string *)local_a0,(string *)psVar3);
    std::
    vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
    ::push_back(&this->SourceGroups,(value_type *)local_a0);
    SourceGroup::~SourceGroup((SourceGroup *)local_a0);
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>
                       *)&local_28);
  pvVar5 = std::
           vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
           ::operator[](&this->SourceGroups,(ulong)ppVar4->second);
  Json::Value::Value(&local_d8,
                     i.
                     super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                     ._M_cur._4_4_);
  Json::Value::append(&pvVar5->SourceIndexes,&local_d8);
  Json::Value::~Value(&local_d8);
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>
                       *)&local_28);
  return ppVar4->second;
}

Assistant:

Json::ArrayIndex Target::AddSourceGroup(cmSourceGroup* sg, Json::ArrayIndex si)
{
  std::unordered_map<cmSourceGroup const*, Json::ArrayIndex>::iterator i =
    this->SourceGroupsMap.find(sg);
  if (i == this->SourceGroupsMap.end()) {
    auto sgIndex = static_cast<Json::ArrayIndex>(this->SourceGroups.size());
    i = this->SourceGroupsMap.emplace(sg, sgIndex).first;
    SourceGroup g;
    g.Name = sg->GetFullName();
    this->SourceGroups.push_back(std::move(g));
  }
  this->SourceGroups[i->second].SourceIndexes.append(si);
  return i->second;
}